

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O2

void __thiscall CGL::DrawRend::keyboard_event(DrawRend *this,int key,int event,uchar mods)

{
  size_type sVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double __x;
  allocator_type local_71;
  vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_> samplebuffer_row
  ;
  SampleBuffer local_40;
  
  if (event == 1) {
    uVar2 = key - 0x31;
    if ((uVar2 < 9) &&
       ((ulong)uVar2 <
        (ulong)((long)(this->svgs).super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->svgs).super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3))) {
      this->current_svg = (ulong)uVar2;
LAB_00156358:
      redraw(this);
      return;
    }
    if (key == 0x5a) {
      this->show_zoom = (this->show_zoom + 1) % 2;
    }
    else {
      if (key == 0x2d) {
        if (this->sample_rate < 2) {
          return;
        }
        __x = (double)this->sample_rate;
        dVar5 = SQRT(__x);
        dVar4 = dVar5 + -1.0;
        if (__x < 0.0) {
          dVar5 = sqrt(__x);
        }
        this->sample_rate = (int)((dVar5 + -1.0) * (double)(int)dVar4);
        std::
        vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
        ::clear(&this->samplebuffer);
        sVar1 = this->width;
        dVar4 = (double)this->sample_rate;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        SampleBuffer::SampleBuffer
                  (&local_40,
                   (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
        std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
        vector(&samplebuffer_row,sVar1,&local_40,&local_71);
        std::
        vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::~vector(&local_40.sub_pixels);
        for (uVar3 = 0; uVar3 < this->height; uVar3 = uVar3 + 1) {
          std::
          vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ::push_back(&this->samplebuffer,&samplebuffer_row);
        }
        redraw(this);
      }
      else {
        if (key != 0x3d) {
          if (key == 0x4c) {
            this->lsm = (int)(this->lsm + L_NEAREST) % 3;
          }
          else if (key == 0x50) {
            this->psm = (int)(this->psm + P_LINEAR) % 2;
          }
          else {
            if (key == 0x53) {
              write_screenshot(this);
              return;
            }
            if (key != 0x20) {
              return;
            }
            view_init(this);
          }
          goto LAB_00156358;
        }
        if (0xf < this->sample_rate) {
          return;
        }
        dVar4 = (double)this->sample_rate;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar5 = (double)this->sample_rate;
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        this->sample_rate = (int)((dVar5 + 1.0) * (double)(int)(dVar4 + 1.0));
        std::
        vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
        ::clear(&this->samplebuffer);
        dVar4 = (double)this->sample_rate;
        sVar1 = this->width;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        SampleBuffer::SampleBuffer
                  (&local_40,
                   (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
        std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
        vector(&samplebuffer_row,sVar1,&local_40,&local_71);
        std::
        vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::~vector(&local_40.sub_pixels);
        for (uVar3 = 0; uVar3 < this->height; uVar3 = uVar3 + 1) {
          std::
          vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ::push_back(&this->samplebuffer,&samplebuffer_row);
        }
        redraw(this);
      }
      std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
      ~vector(&samplebuffer_row);
    }
  }
  return;
}

Assistant:

void DrawRend::keyboard_event( int key, int event, unsigned char mods ) {
  if (event != EVENT_PRESS)
    return;

  // tab through the loaded files
  if (key >= '1' && key <= '9' && key-'1' < svgs.size()) {
    current_svg = key - '1';
    redraw();
    return;
  }

  switch( key ) {

    // reset view transformation
    case ' ':
      view_init();
      redraw();
      break;

    // set the sampling rate to 1, 4, 9, or 16
    case '=':
      if (sample_rate < 16) {
        sample_rate = (int)(sqrt(sample_rate)+1)*(sqrt(sample_rate)+1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;
    case '-':
      if (sample_rate > 1) {
        sample_rate = (int)(sqrt(sample_rate)-1)*(sqrt(sample_rate)-1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;

    // save the current buffer to disk
    case 'S':
      write_screenshot();
      break;

    // toggle pixel sampling scheme
    case 'P':
      psm = (PixelSampleMethod)((psm+1)%2);
      redraw();
      break;
    // toggle level sampling scheme
    case 'L':
      lsm = (LevelSampleMethod)((lsm+1)%3);
      redraw();
      break;

    // toggle zoom
    case 'Z':
      show_zoom = (show_zoom+1)%2;
      break;

    default:
      return;
  }
}